

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unsubtyping.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_22::Unsubtyping::noteSubtype(Unsubtyping *this,Type sub,Type super)

{
  Type sub_00;
  size_t sVar1;
  size_t sVar2;
  Type *pTVar3;
  HeapType sub_01;
  HeapType super_00;
  Type local_40;
  Type sub_local;
  Type super_local;
  
  local_40.id = sub.id;
  sub_local = super;
  if ((sub.id & 1) == 0 || sub.id < 7) {
    if (((sub.id & 1) == 0 && 6 < sub.id) && ((super.id & 1) == 0 && 6 < super.id)) {
      sub_01 = wasm::Type::getHeapType(&local_40);
      super_00 = wasm::Type::getHeapType(&sub_local);
      noteSubtype(this,sub_01,super_00);
    }
    return;
  }
  if ((6 < super.id) && ((super.id & 1) != 0)) {
    sVar1 = wasm::Type::size(&local_40);
    sVar2 = wasm::Type::size(&sub_local);
    if (sVar1 == sVar2) {
      sVar1 = wasm::Type::size(&local_40);
      for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
        pTVar3 = wasm::Type::operator[](&local_40,sVar2);
        sub_00.id = pTVar3->id;
        pTVar3 = wasm::Type::operator[](&sub_local,sVar2);
        noteSubtype(this,sub_00,(Type)pTVar3->id);
      }
      return;
    }
  }
  __assert_fail("super.isTuple() && sub.size() == super.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Unsubtyping.cpp"
                ,0xad,"void wasm::(anonymous namespace)::Unsubtyping::noteSubtype(Type, Type)");
}

Assistant:

void noteSubtype(Type sub, Type super) {
    if (sub.isTuple()) {
      assert(super.isTuple() && sub.size() == super.size());
      for (size_t i = 0, size = sub.size(); i < size; ++i) {
        noteSubtype(sub[i], super[i]);
      }
      return;
    }
    if (!sub.isRef() || !super.isRef()) {
      return;
    }
    noteSubtype(sub.getHeapType(), super.getHeapType());
  }